

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O3

ExtremeValues * __thiscall
bezier::Bezier<2UL>::derivativeZero2(ExtremeValues *__return_storage_ptr__,Bezier<2UL> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ExtremeValue local_20;
  
  (__return_storage_ptr__->values).
  super__Vector_base<bezier::ExtremeValue,_std::allocator<bezier::ExtremeValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<bezier::ExtremeValue,_std::allocator<bezier::ExtremeValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).
  super__Vector_base<bezier::ExtremeValue,_std::allocator<bezier::ExtremeValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = (this->mControlPoints)._M_elems[1].x;
  dVar2 = (this->mControlPoints)._M_elems[0].x;
  dVar3 = (this->mControlPoints)._M_elems[0].y;
  dVar4 = (this->mControlPoints)._M_elems[1].y;
  dVar5 = (this->mControlPoints)._M_elems[2].y;
  local_20.t = (dVar2 - dVar1) / ((dVar2 - (dVar1 + dVar1)) + (this->mControlPoints)._M_elems[2].x);
  if ((-0.0001 <= local_20.t) && (local_20.t <= 1.0001)) {
    local_20.axis = 0;
    ExtremeValues::add(__return_storage_ptr__,&local_20);
  }
  local_20.t = (dVar3 - dVar4) / ((dVar3 - (dVar4 + dVar4)) + dVar5);
  if ((-0.0001 <= local_20.t) && (local_20.t <= 1.0001)) {
    local_20.axis = 1;
    ExtremeValues::add(__return_storage_ptr__,&local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

ExtremeValues derivativeZero2() const
        {
            assert(N == 2);
            ExtremeValues xVals;
            Point roots = (mControlPoints[0] - mControlPoints[1]) / (mControlPoints[0] - mControlPoints[1] * 2 + mControlPoints[2]);
            if (internal::isWithinZeroAndOne(roots[0]))
                xVals.add(roots[0], 0);
            if (internal::isWithinZeroAndOne(roots[1]))
                xVals.add(roots[1], 1);
            return xVals;
        }